

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar5;
  bool bVar6;
  double *pdVar7;
  ulong uVar8;
  value_type vVar9;
  
  pFVar3 = (((((fadexpr->fadexpr_).left_)->fadexpr_).expr_)->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  uVar1 = *(uint *)((long)(pFVar4->fadexpr_).left_ + 8);
  uVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 <= (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 <= (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar8 = (long)(int)uVar2 << 3;
      }
      pdVar7 = (double *)operator_new__(uVar8);
      (this->dx_).ptr_to_data = pdVar7;
    }
  }
  if (uVar2 != 0) {
    pdVar7 = (this->dx_).ptr_to_data;
    bVar6 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>
            ::hasFastAccess(&fadexpr->fadexpr_);
    if (bVar6) {
      if (0 < (int)uVar2) {
        uVar8 = 0;
        do {
          vVar9 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>
                  ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar8);
          pdVar7[uVar8] = vVar9;
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
    }
    else if (0 < (int)uVar2) {
      uVar8 = 0;
      do {
        vVar9 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar8);
        pdVar7[uVar8] = vVar9;
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
  }
  pFVar5 = (((fadexpr->fadexpr_).left_)->fadexpr_).expr_;
  pFVar3 = (pFVar5->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  this->val_ = (-(pFVar5->fadexpr_).left_.constant_ /
               (((pFVar4->fadexpr_).left_)->val_ * ((pFVar4->fadexpr_).right_)->val_ *
               ((pFVar3->fadexpr_).right_)->val_)) * ((fadexpr->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}